

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O3

void __thiscall NLProblemBuilderTest_OnCall_Test::TestBody(NLProblemBuilderTest_OnCall_Test *this)

{
  MockProblemBuilder *mock_obj;
  FunctionMocker<TestFunction_(int)> *this_00;
  FunctionMocker<TestCallExprBuilder_(TestFunction,_int)> *this_01;
  FunctionMocker<BasicTestExpr<1>_(TestCallExprBuilder)> *this_02;
  linked_ptr<const_testing::MatcherInterface<int>_> *this_03;
  Result gmock_a1;
  MockSpec<TestFunction_(int)> *this_04;
  TypedExpectation<TestFunction_(int)> *this_05;
  MockSpec<TestCallExprBuilder_(TestFunction,_int)> *this_06;
  TypedExpectation<TestCallExprBuilder_(TestFunction,_int)> *this_07;
  MockSpec<BasicTestExpr<1>_(TestCallExprBuilder)> *this_08;
  TypedExpectation<BasicTestExpr<1>_(TestCallExprBuilder)> *this_09;
  Matcher<TestCallExprBuilder> local_60;
  Matcher<int> local_48;
  linked_ptr<testing::ActionInterface<TestCallExprBuilder_(TestFunction,_int)>_> local_30;
  
  mock_obj = &(this->super_NLProblemBuilderTest).builder.super_MockProblemBuilder;
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_60,0x2a);
  this_00 = &(this->super_NLProblemBuilderTest).builder.super_MockProblemBuilder.gmock1_function_243
  ;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_00,mock_obj);
  this_04 = testing::internal::FunctionMocker<TestFunction_(int)>::With
                      (this_00,(Matcher<int> *)&local_60);
  this_05 = testing::internal::MockSpec<TestFunction_(int)>::InternalExpectedAt
                      (this_04,
                       "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                       ,0x7bc,"builder","function(42)");
  local_48.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)operator_new(0x10);
  ((ActionInterface<TestFunction_(int)> *)local_48.super_MatcherBase<int>._vptr_MatcherBase)->
  _vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002f98b8;
  *(undefined4 *)
   &((ActionInterface<TestFunction_(int)> *)local_48.super_MatcherBase<int>._vptr_MatcherBase)[1].
    _vptr_ActionInterface = 0x2a;
  local_48.super_MatcherBase<int>.impl_.value_ =
       (MatcherInterface<int> *)&local_48.super_MatcherBase<int>.impl_;
  testing::internal::TypedExpectation<TestFunction_(int)>::WillOnce
            (this_05,(Action<TestFunction_(int)> *)&local_48);
  testing::internal::linked_ptr<testing::ActionInterface<TestFunction_(int)>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<TestFunction_(int)>_> *)&local_48);
  local_60.super_MatcherBase<TestCallExprBuilder>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002ef528;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)
             &local_60.super_MatcherBase<TestCallExprBuilder>.impl_);
  testing::Matcher<TestFunction>::Matcher((Matcher<TestFunction> *)&local_60,(TestFunction)0x2a);
  testing::Matcher<int>::Matcher(&local_48,0xb);
  this_01 = &(this->super_NLProblemBuilderTest).builder.super_MockProblemBuilder.
             gmock2_BeginCall_279;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_01,mock_obj);
  this_06 = testing::internal::FunctionMocker<TestCallExprBuilder_(TestFunction,_int)>::With
                      (this_01,(Matcher<TestFunction> *)&local_60,&local_48);
  this_07 = testing::internal::MockSpec<TestCallExprBuilder_(TestFunction,_int)>::InternalExpectedAt
                      (this_06,
                       "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                       ,0x7bd,"builder","BeginCall(func, 11)");
  local_30.value_ = (ActionInterface<TestCallExprBuilder_(TestFunction,_int)> *)operator_new(0x10);
  (local_30.value_)->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002f9a58;
  *(undefined4 *)&local_30.value_[1]._vptr_ActionInterface = 0x2a;
  local_30.link_.next_ = &local_30.link_;
  testing::internal::TypedExpectation<TestCallExprBuilder_(TestFunction,_int)>::WillOnce
            (this_07,(Action<TestCallExprBuilder_(TestFunction,_int)> *)&local_30);
  testing::internal::linked_ptr<testing::ActionInterface<TestCallExprBuilder_(TestFunction,_int)>_>
  ::~linked_ptr(&local_30);
  this_03 = &local_48.super_MatcherBase<int>.impl_;
  local_48.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_002ef528;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr(this_03);
  local_60.super_MatcherBase<TestCallExprBuilder>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f1e48;
  testing::internal::linked_ptr<const_testing::MatcherInterface<TestFunction>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<TestFunction>_> *)
             &local_60.super_MatcherBase<TestCallExprBuilder>.impl_);
  gmock_a1 = MockProblemBuilder::function((this->super_NLProblemBuilderTest).adapter.builder_,0x2a);
  MockProblemBuilder::BeginCall
            ((this->super_NLProblemBuilderTest).adapter.builder_,(Argument1)gmock_a1.id_,0xb);
  testing::Matcher<TestCallExprBuilder>::Matcher(&local_60,(TestCallExprBuilder)0x2a);
  this_02 = &(this->super_NLProblemBuilderTest).builder.super_MockProblemBuilder.gmock1_EndCall_280;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_02,mock_obj);
  this_08 = testing::internal::FunctionMocker<BasicTestExpr<1>_(TestCallExprBuilder)>::With
                      (this_02,&local_60);
  this_09 = testing::internal::MockSpec<BasicTestExpr<1>_(TestCallExprBuilder)>::InternalExpectedAt
                      (this_08,
                       "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                       ,0x7bf,"builder","EndCall(call_builder)");
  local_48.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)operator_new(0x10);
  ((ActionInterface<TestFunction_(int)> *)local_48.super_MatcherBase<int>._vptr_MatcherBase)->
  _vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002f9bf8;
  *(undefined4 *)
   &((ActionInterface<TestFunction_(int)> *)local_48.super_MatcherBase<int>._vptr_MatcherBase)[1].
    _vptr_ActionInterface = 0x2a;
  local_48.super_MatcherBase<int>.impl_.value_ = (MatcherInterface<int> *)this_03;
  testing::internal::TypedExpectation<BasicTestExpr<1>_(TestCallExprBuilder)>::WillOnce
            (this_09,(Action<BasicTestExpr<1>_(TestCallExprBuilder)> *)&local_48);
  testing::internal::linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestCallExprBuilder)>_>::
  ~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestCallExprBuilder)>_> *)
              &local_48);
  local_60.super_MatcherBase<TestCallExprBuilder>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f1eb0;
  testing::internal::linked_ptr<const_testing::MatcherInterface<TestCallExprBuilder>_>::~linked_ptr
            (&local_60.super_MatcherBase<TestCallExprBuilder>.impl_);
  MockProblemBuilder::EndCall((this->super_NLProblemBuilderTest).adapter.builder_,(Argument1)0x2a);
  return;
}

Assistant:

TEST_F(NLProblemBuilderTest, OnCall) {
  auto func = TestFunction(ID);
  auto call_builder = TestCallExprBuilder(ID);
  EXPECT_CALL(builder, function(42)).WillOnce(Return(func));
  EXPECT_CALL(builder, BeginCall(func, 11)).WillOnce(Return(call_builder));
  adapter.BeginCall(42, 11);
  EXPECT_CALL(builder, EndCall(call_builder)).
      WillOnce(Return(TestNumericExpr(ID)));
  adapter.EndCall(call_builder);
}